

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O3

bool __thiscall HttpContext::ParseRequest(HttpContext *this,BufferPtr *buf,uint64_t receive_time)

{
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  char *colon;
  char *end;
  bool bVar4;
  uint32_t need_len;
  char line_buf [1024];
  undefined1 local_44d;
  undefined4 local_44c;
  HttpRequest *local_448;
  undefined8 local_440;
  char local_438 [1032];
  
  local_448 = &this->_request;
  local_440 = receive_time;
LAB_00107050:
  do {
    do {
      if (this->_state == ExpectHeaders) {
        memset(local_438,0,0x400);
        local_44c = 0;
        peVar1 = (buf->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        uVar3 = (*peVar1->_vptr_Buffer[7])(peVar1,local_438,0x400,"\r\n",2,&local_44c);
        if (uVar3 != 0) {
          end = local_438 + ((ulong)uVar3 - 2);
          local_44d = 0x3a;
          colon = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (local_438,end,&local_44d);
          if (colon != end) {
            HttpRequest::AddHeader(local_448,local_438,colon,end);
            goto LAB_00107050;
          }
          this->_state = GotAll;
        }
        return true;
      }
    } while (this->_state != ExpectRequestLine);
    memset(local_438,0,0x400);
    local_44c = 0;
    peVar1 = (buf->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Buffer[7])(peVar1,local_438,0x400,"\r\n",2,&local_44c);
    bVar4 = uVar3 == 0;
    if (bVar4) {
      return bVar4;
    }
    bVar2 = processRequestLine(this,local_438,local_438 + uVar3);
    if (!bVar2) {
      return bVar4;
    }
    (this->_request)._receive_time = local_440;
    this->_state = ExpectHeaders;
  } while( true );
}

Assistant:

bool HttpContext::ParseRequest(cppnet::BufferPtr buf, uint64_t receive_time) {
    bool ok = true;
    bool hasMore = true;
    while (hasMore) {
        if (_state == ExpectRequestLine) {
            char line_buf[1024] = {0};
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            if (size > 0) {
                ok = processRequestLine(line_buf, line_buf + size);
                if (ok) {
                    _request.SetReceiveTime(receive_time);
                    _state = ExpectHeaders;

                } else {
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectHeaders) {
            char line_buf[1024] = { 0 };
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            char* end = line_buf + size - CRLF_LEN;
            if (size > 0) {
                const char* colon = std::find(line_buf, end, ':');
                if (colon != end) {
                    _request.AddHeader(line_buf, colon, end);

                } else {
                    // empty line, end of header
                    // FIXME:
                    _state = GotAll;
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectBody) {
            // TODO:
        }
    }
    return ok;
}